

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O3

TupleDataScatterFunction *
duckdb::TupleDataCollection::GetScatterFunction
          (TupleDataScatterFunction *__return_storage_ptr__,LogicalType *type,bool within_collection
          )

{
  vector<duckdb::TupleDataScatterFunction,_true> *this;
  PhysicalType PVar1;
  pointer ppVar2;
  code *pcVar3;
  LogicalType *pLVar4;
  child_list_t<LogicalType> *pcVar5;
  InternalException *this_00;
  code *pcVar6;
  pointer ppVar7;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  this = &__return_storage_ptr__->child_functions;
  (__return_storage_ptr__->child_functions).
  super_vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>.
  super__Vector_base<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->child_functions).
  super_vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>.
  super__Vector_base<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->child_functions).
  super_vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>.
  super__Vector_base<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PVar1 = type->physical_type_;
  if (199 < PVar1) {
    if (PVar1 == VARCHAR) {
      pcVar3 = TupleDataTemplatedWithinCollectionScatter<duckdb::string_t>;
      pcVar6 = TupleDataTemplatedScatter<duckdb::string_t>;
    }
    else if (PVar1 == UINT128) {
      pcVar3 = TupleDataTemplatedWithinCollectionScatter<duckdb::uhugeint_t>;
      pcVar6 = TupleDataTemplatedScatter<duckdb::uhugeint_t>;
    }
    else {
      if (PVar1 != INT128) goto switchD_00b0ed98_caseD_a;
      pcVar3 = TupleDataTemplatedWithinCollectionScatter<duckdb::hugeint_t>;
      pcVar6 = TupleDataTemplatedScatter<duckdb::hugeint_t>;
    }
    goto LAB_00b0efcb;
  }
  switch(PVar1) {
  case BOOL:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<bool>;
    pcVar6 = TupleDataTemplatedScatter<bool>;
    break;
  case UINT8:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<unsigned_char>;
    pcVar6 = TupleDataTemplatedScatter<unsigned_char>;
    break;
  case INT8:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<signed_char>;
    pcVar6 = TupleDataTemplatedScatter<signed_char>;
    break;
  case UINT16:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<unsigned_short>;
    pcVar6 = TupleDataTemplatedScatter<unsigned_short>;
    break;
  case INT16:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<short>;
    pcVar6 = TupleDataTemplatedScatter<short>;
    break;
  case UINT32:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<unsigned_int>;
    pcVar6 = TupleDataTemplatedScatter<unsigned_int>;
    break;
  case INT32:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<int>;
    pcVar6 = TupleDataTemplatedScatter<int>;
    break;
  case UINT64:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<unsigned_long>;
    pcVar6 = TupleDataTemplatedScatter<unsigned_long>;
    break;
  case INT64:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<long>;
    pcVar6 = TupleDataTemplatedScatter<long>;
    break;
  default:
switchD_00b0ed98_caseD_a:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._0_8_ = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Unsupported type for TupleDataCollection::GetScatterFunction","")
    ;
    InternalException::InternalException(this_00,(string *)local_50);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<float>;
    pcVar6 = TupleDataTemplatedScatter<float>;
    break;
  case DOUBLE:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<double>;
    pcVar6 = TupleDataTemplatedScatter<double>;
    break;
  case INTERVAL:
    pcVar3 = TupleDataTemplatedWithinCollectionScatter<duckdb::interval_t>;
    pcVar6 = TupleDataTemplatedScatter<duckdb::interval_t>;
    break;
  case LIST:
    pcVar6 = TupleDataListScatter;
    if (within_collection) {
      pcVar6 = TupleDataCollectionWithinCollectionScatter<duckdb::ListVector>;
    }
    __return_storage_ptr__->function = pcVar6;
    pLVar4 = ListType::GetChildType(type);
    GetScatterFunction((TupleDataScatterFunction *)local_50,pLVar4,true);
    ::std::
    vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>::
    emplace_back<duckdb::TupleDataScatterFunction>
              (&this->
                super_vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
               ,(TupleDataScatterFunction *)local_50);
    goto LAB_00b0efa1;
  case STRUCT:
    pcVar6 = TupleDataStructScatter;
    if (within_collection) {
      pcVar6 = TupleDataStructWithinCollectionScatter;
    }
    __return_storage_ptr__->function = pcVar6;
    pcVar5 = StructType::GetChildTypes_abi_cxx11_(type);
    ppVar7 = (pcVar5->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (pcVar5->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar7 == ppVar2) {
      return __return_storage_ptr__;
    }
    do {
      GetScatterFunction((TupleDataScatterFunction *)local_50,&ppVar7->second,within_collection);
      ::std::
      vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>::
      emplace_back<duckdb::TupleDataScatterFunction>
                (&this->
                  super_vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
                 ,(TupleDataScatterFunction *)local_50);
      ::std::
      vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>::
      ~vector((vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
               *)(local_50 + 8));
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar2);
    return __return_storage_ptr__;
  case ARRAY:
    pcVar6 = TupleDataArrayScatter;
    if (within_collection) {
      pcVar6 = TupleDataCollectionWithinCollectionScatter<duckdb::ArrayVector>;
    }
    __return_storage_ptr__->function = pcVar6;
    pLVar4 = ArrayType::GetChildType(type);
    GetScatterFunction((TupleDataScatterFunction *)local_50,pLVar4,true);
    ::std::
    vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>::
    emplace_back<duckdb::TupleDataScatterFunction>
              (&this->
                super_vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
               ,(TupleDataScatterFunction *)local_50);
LAB_00b0efa1:
    ::std::
    vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>::
    ~vector((vector<duckdb::TupleDataScatterFunction,_std::allocator<duckdb::TupleDataScatterFunction>_>
             *)(local_50 + 8));
    return __return_storage_ptr__;
  }
LAB_00b0efcb:
  if (within_collection) {
    pcVar6 = pcVar3;
  }
  __return_storage_ptr__->function = pcVar6;
  return __return_storage_ptr__;
}

Assistant:

TupleDataScatterFunction TupleDataCollection::GetScatterFunction(const LogicalType &type, bool within_collection) {
	TupleDataScatterFunction result;
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		result.function = TupleDataGetScatterFunction<bool>(within_collection);
		break;
	case PhysicalType::INT8:
		result.function = TupleDataGetScatterFunction<int8_t>(within_collection);
		break;
	case PhysicalType::INT16:
		result.function = TupleDataGetScatterFunction<int16_t>(within_collection);
		break;
	case PhysicalType::INT32:
		result.function = TupleDataGetScatterFunction<int32_t>(within_collection);
		break;
	case PhysicalType::INT64:
		result.function = TupleDataGetScatterFunction<int64_t>(within_collection);
		break;
	case PhysicalType::INT128:
		result.function = TupleDataGetScatterFunction<hugeint_t>(within_collection);
		break;
	case PhysicalType::UINT8:
		result.function = TupleDataGetScatterFunction<uint8_t>(within_collection);
		break;
	case PhysicalType::UINT16:
		result.function = TupleDataGetScatterFunction<uint16_t>(within_collection);
		break;
	case PhysicalType::UINT32:
		result.function = TupleDataGetScatterFunction<uint32_t>(within_collection);
		break;
	case PhysicalType::UINT64:
		result.function = TupleDataGetScatterFunction<uint64_t>(within_collection);
		break;
	case PhysicalType::UINT128:
		result.function = TupleDataGetScatterFunction<uhugeint_t>(within_collection);
		break;
	case PhysicalType::FLOAT:
		result.function = TupleDataGetScatterFunction<float>(within_collection);
		break;
	case PhysicalType::DOUBLE:
		result.function = TupleDataGetScatterFunction<double>(within_collection);
		break;
	case PhysicalType::INTERVAL:
		result.function = TupleDataGetScatterFunction<interval_t>(within_collection);
		break;
	case PhysicalType::VARCHAR:
		result.function = TupleDataGetScatterFunction<string_t>(within_collection);
		break;
	case PhysicalType::STRUCT: {
		result.function = within_collection ? TupleDataStructWithinCollectionScatter : TupleDataStructScatter;
		for (const auto &child_type : StructType::GetChildTypes(type)) {
			result.child_functions.push_back(GetScatterFunction(child_type.second, within_collection));
		}
		break;
	}
	case PhysicalType::LIST:
		result.function =
		    within_collection ? TupleDataCollectionWithinCollectionScatter<ListVector> : TupleDataListScatter;
		result.child_functions.emplace_back(GetScatterFunction(ListType::GetChildType(type), true));
		break;
	case PhysicalType::ARRAY:
		result.function =
		    within_collection ? TupleDataCollectionWithinCollectionScatter<ArrayVector> : TupleDataArrayScatter;
		result.child_functions.emplace_back(GetScatterFunction(ArrayType::GetChildType(type), true));
		break;
	default:
		throw InternalException("Unsupported type for TupleDataCollection::GetScatterFunction");
	}
	return result;
}